

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[144],char_const*,char[31],unsigned_int,char[19],int,char[267]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [144],char **Args_1,
          char (*Args_2) [31],uint *Args_3,char (*Args_4) [19],int *Args_5,char (*Args_6) [267])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[144],char_const*,char[31],unsigned_int,char[19],int,char[267]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [144])this,(char **)Args,(char (*) [31])Args_1,(uint *)Args_2,
             (char (*) [19])Args_3,(int *)Args_4,(char (*) [267])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}